

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::GetSnapShotBoundInterval
          (EventLog *this,int64 targetTime,int64 *snapIntervalStart,int64 *snapIntervalEnd)

{
  EventLogEntry *pEVar1;
  SnapshotEventLogEntry *pSVar2;
  undefined1 local_48 [8];
  Iterator iter;
  
  *snapIntervalStart = -1;
  *snapIntervalEnd = -1;
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_48,&this->m_eventList);
  do {
    if (((local_48 == (undefined1  [8])0x0) ||
        (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8))) ||
       ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink)) goto LAB_00809460;
    pEVar1 = TTEventList::Iterator::Current((Iterator *)local_48);
    if (pEVar1->EventKind == SnapshotTag) {
      pEVar1 = TTEventList::Iterator::Current((Iterator *)local_48);
      pSVar2 = NSLogEvents::
               GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                         (pEVar1);
      if (pSVar2->RestoreTimestamp <= targetTime) {
        *snapIntervalStart = pSVar2->RestoreTimestamp;
LAB_00809460:
        while( true ) {
          if (local_48 == (undefined1  [8])0x0) {
            return;
          }
          if (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8)) break;
          if ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink) {
            return;
          }
          pEVar1 = TTEventList::Iterator::Current((Iterator *)local_48);
          if (pEVar1->EventKind == SnapshotTag) {
            pEVar1 = TTEventList::Iterator::Current((Iterator *)local_48);
            pSVar2 = NSLogEvents::
                     GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                               (pEVar1);
            if (*snapIntervalStart < pSVar2->RestoreTimestamp) {
              *snapIntervalEnd = pSVar2->RestoreTimestamp;
              return;
            }
          }
          TTEventList::Iterator::MoveNext((Iterator *)local_48);
        }
        return;
      }
    }
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_48);
  } while( true );
}

Assistant:

void EventLog::GetSnapShotBoundInterval(int64 targetTime, int64* snapIntervalStart, int64* snapIntervalEnd) const
    {
        *snapIntervalStart = -1;
        *snapIntervalEnd = -1;

        //move the iterator to the current snapshot just before the event
        auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly();
        while(iter.IsValid())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp <= targetTime)
                {
                    *snapIntervalStart = snapEvent->RestoreTimestamp;
                    break;
                }
            }

            iter.MovePrevious_ReplayOnly();
        }

        //now move the iter to the next snapshot
        while(iter.IsValid())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(*snapIntervalStart < snapEvent->RestoreTimestamp)
                {
                    *snapIntervalEnd = snapEvent->RestoreTimestamp;
                    break;
                }
            }

            iter.MoveNext();
        }
    }